

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

value_type * __thiscall
llvm::
DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
::FindAndConstruct(DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                   *this,DBKeyID *Key)

{
  bool bVar1;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *ConstFoundBucket;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *local_20;
  
  bVar1 = LookupBucketFor<DBKeyID>(this,Key,&local_20);
  if (!bVar1) {
    local_20 = InsertIntoBucketImpl<DBKeyID>(this,Key,Key,local_20);
    (local_20->super_pair<DBKeyID,_llbuild::core::KeyID>).first.value = Key->value;
    (local_20->super_pair<DBKeyID,_llbuild::core::KeyID>).second._value = 0;
  }
  return local_20;
}

Assistant:

value_type& FindAndConstruct(const KeyT &Key) {
    BucketT *TheBucket;
    if (LookupBucketFor(Key, TheBucket))
      return *TheBucket;

    return *InsertIntoBucket(TheBucket, Key);
  }